

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::GetData
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,BufferImplType **pSBTBuffer,
          BindingTable *RaygenShaderBindingTable,BindingTable *MissShaderBindingTable,
          BindingTable *HitShaderBindingTable,BindingTable *CallableShaderBindingTable)

{
  RefCntAutoPtr<Diligent::BufferVkImpl> *this_00;
  uint alignment;
  pointer puVar1;
  pointer puVar2;
  type_conflict tVar3;
  type_conflict tVar4;
  type_conflict tVar5;
  type_conflict tVar6;
  RenderDeviceVkImpl *pRVar7;
  string *Args_1;
  BufferImplType *pBVar8;
  pointer puVar9;
  string msg;
  String BuffName;
  string local_98;
  undefined1 local_78 [32];
  Uint64 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pRVar7 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  alignment = (pRVar7->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
              ShaderGroupBaseAlignment;
  tVar3 = AlignUp<unsigned_int,unsigned_int>
                    (*(int *)&(this->m_RayGenShaderRecord).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_RayGenShaderRecord).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,alignment);
  tVar4 = AlignUp<unsigned_int,unsigned_int>
                    ((*(int *)&(this->m_MissShadersRecord).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_MissShadersRecord).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + tVar3,alignment);
  tVar5 = AlignUp<unsigned_int,unsigned_int>
                    ((*(int *)&(this->m_HitGroupsRecord).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_HitGroupsRecord).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + tVar4,alignment);
  tVar6 = AlignUp<unsigned_int,unsigned_int>
                    ((*(int *)&(this->m_CallableShadersRecord).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_CallableShadersRecord).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + tVar5,alignment);
  pBVar8 = (this->m_pBuffer).m_pObject;
  local_78._8_8_ = ZEXT48(tVar6);
  if ((pBVar8 == (BufferImplType *)0x0) ||
     ((pBVar8->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Size < (ulong)local_78._8_8_)) {
    this_00 = &this->m_pBuffer;
    RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(this_00,(BufferVkImpl *)0x0);
    std::__cxx11::string::string
              ((string *)local_78,
               (this->
               super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
               ).m_Desc.super_DeviceObjectAttribs.Name,(allocator *)&local_98);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   " - internal buffer");
    std::__cxx11::string::~string((string *)local_78);
    local_78._25_3_ = 0;
    local_78._21_4_ = 0;
    local_58 = 1;
    local_78._0_8_ = local_50._M_dataplus._M_p;
    local_78[0x14] = '\x01';
    local_78._16_4_ = 0x400;
    pRVar7 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                        );
    local_98._M_dataplus._M_p = (pointer)this_00->m_pObject;
    Args_1 = &local_98;
    local_98._M_string_length = (size_type)this_00;
    RenderDeviceVkImpl::CreateBuffer
              (pRVar7,(BufferDesc *)local_78,(BufferData *)0x0,(IBuffer **)Args_1);
    RefCntAutoPtr<Diligent::BufferVkImpl>::DoublePtrHelper<Diligent::IBuffer>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IBuffer> *)&local_98);
    if (this_00->m_pObject == (BufferVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_98,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pBuffer != nullptr",(char (*) [21])Args_1);
      DebugAssertionFailed
                (local_98._M_dataplus._M_p,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x1dd);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)&local_50);
    pBVar8 = this_00->m_pObject;
    if (pBVar8 == (BufferImplType *)0x0) {
      return;
    }
  }
  *pSBTBuffer = pBVar8;
  puVar1 = (this->m_RayGenShaderRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_RayGenShaderRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar9 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar9 = puVar1;
    }
    RaygenShaderBindingTable->pData = puVar9;
    RaygenShaderBindingTable->Offset = 0;
    RaygenShaderBindingTable->Size = (int)puVar2 - (int)puVar1;
    RaygenShaderBindingTable->Stride = this->m_ShaderRecordStride;
  }
  puVar1 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_MissShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar9 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar9 = puVar1;
    }
    MissShaderBindingTable->pData = puVar9;
    MissShaderBindingTable->Offset = tVar3;
    MissShaderBindingTable->Size = (int)puVar2 - (int)puVar1;
    MissShaderBindingTable->Stride = this->m_ShaderRecordStride;
  }
  puVar1 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_HitGroupsRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar9 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar9 = puVar1;
    }
    HitShaderBindingTable->pData = puVar9;
    HitShaderBindingTable->Offset = tVar4;
    HitShaderBindingTable->Size = (int)puVar2 - (int)puVar1;
    HitShaderBindingTable->Stride = this->m_ShaderRecordStride;
  }
  puVar1 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_CallableShadersRecord).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    puVar9 = (pointer)0x0;
    if (this->m_Changed != false) {
      puVar9 = puVar1;
    }
    CallableShaderBindingTable->pData = puVar9;
    CallableShaderBindingTable->Offset = tVar5;
    CallableShaderBindingTable->Size = (int)puVar2 - (int)puVar1;
    CallableShaderBindingTable->Stride = this->m_ShaderRecordStride;
  }
  this->m_Changed = false;
  return;
}

Assistant:

void GetData(BufferImplType*& pSBTBuffer,
                 BindingTable&    RaygenShaderBindingTable,
                 BindingTable&    MissShaderBindingTable,
                 BindingTable&    HitShaderBindingTable,
                 BindingTable&    CallableShaderBindingTable)
    {
        const Uint32 ShaderGroupBaseAlignment = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupBaseAlignment;

        const auto AlignToLarger = [ShaderGroupBaseAlignment](size_t offset) -> Uint32 {
            return AlignUp(static_cast<Uint32>(offset), ShaderGroupBaseAlignment);
        };

        const Uint32 RayGenOffset          = 0;
        const Uint32 MissShaderOffset      = AlignToLarger(m_RayGenShaderRecord.size());
        const Uint32 HitGroupOffset        = AlignToLarger(MissShaderOffset + m_MissShadersRecord.size());
        const Uint32 CallableShadersOffset = AlignToLarger(HitGroupOffset + m_HitGroupsRecord.size());
        const Uint32 BufSize               = AlignToLarger(CallableShadersOffset + m_CallableShadersRecord.size());

        // Recreate buffer
        if (m_pBuffer == nullptr || m_pBuffer->GetDesc().Size < BufSize)
        {
            m_pBuffer = nullptr;

            String     BuffName = String{this->m_Desc.Name} + " - internal buffer";
            BufferDesc BuffDesc;
            BuffDesc.Name      = BuffName.c_str();
            BuffDesc.Usage     = USAGE_DEFAULT;
            BuffDesc.BindFlags = BIND_RAY_TRACING;
            BuffDesc.Size      = BufSize;

            this->GetDevice()->CreateBuffer(BuffDesc, nullptr, m_pBuffer.template DblPtr<IBuffer>());
            VERIFY_EXPR(m_pBuffer != nullptr);
        }

        if (m_pBuffer == nullptr)
            return; // Something went wrong

        pSBTBuffer = m_pBuffer;

        if (!m_RayGenShaderRecord.empty())
        {
            RaygenShaderBindingTable.pData  = m_Changed ? m_RayGenShaderRecord.data() : nullptr;
            RaygenShaderBindingTable.Offset = RayGenOffset;
            RaygenShaderBindingTable.Size   = static_cast<Uint32>(m_RayGenShaderRecord.size());
            RaygenShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_MissShadersRecord.empty())
        {
            MissShaderBindingTable.pData  = m_Changed ? m_MissShadersRecord.data() : nullptr;
            MissShaderBindingTable.Offset = MissShaderOffset;
            MissShaderBindingTable.Size   = static_cast<Uint32>(m_MissShadersRecord.size());
            MissShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_HitGroupsRecord.empty())
        {
            HitShaderBindingTable.pData  = m_Changed ? m_HitGroupsRecord.data() : nullptr;
            HitShaderBindingTable.Offset = HitGroupOffset;
            HitShaderBindingTable.Size   = static_cast<Uint32>(m_HitGroupsRecord.size());
            HitShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_CallableShadersRecord.empty())
        {
            CallableShaderBindingTable.pData  = m_Changed ? m_CallableShadersRecord.data() : nullptr;
            CallableShaderBindingTable.Offset = CallableShadersOffset;
            CallableShaderBindingTable.Size   = static_cast<Uint32>(m_CallableShadersRecord.size());
            CallableShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        m_Changed = false;
    }